

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawWarpedDecal(PixelGameEngine *this,Decal *decal,vf2d *pos,Pixel *tint)

{
  v2d_generic<float> vVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  ulong uVar4;
  undefined4 uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float d [4];
  undefined1 local_80 [32];
  pointer pvStack_60;
  pointer local_58;
  pointer pvStack_50;
  pointer local_48;
  pointer pfStack_40;
  pointer local_38;
  pointer pPStack_30;
  pointer local_28;
  pointer pPStack_20;
  undefined8 local_18;
  
  local_28 = (pointer)0x0;
  pPStack_20 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pPStack_30 = (pointer)0x0;
  local_48 = (pointer)0x0;
  pfStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pvStack_50 = (pointer)0x0;
  local_80._24_8_ = (pointer)0x0;
  pvStack_60 = (pointer)0x0;
  local_80._8_8_ = (pointer)0x0;
  local_80._16_8_ = (pointer)0x0;
  local_18._0_4_ = NORMAL;
  local_18._4_4_ = 4;
  d[1] = (float)(tint->field_0).n;
  d[0] = d[1];
  d[3] = d[1];
  d[2] = d[1];
  local_80._0_8_ = decal;
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)&pPStack_30,d);
  uVar5 = SUB84(tint,0);
  d[0] = 1.0;
  d[1] = 1.0;
  d[2] = 1.0;
  d[3] = 1.0;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&local_48,d);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             (local_80 + 8),4);
  d[0] = 0.0;
  d[1] = 0.0;
  d[2] = 0.0;
  d[3] = 1.0;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>
            ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&pvStack_60,
             d);
  fVar7 = pos->x;
  fVar8 = pos->y;
  fVar9 = pos[2].x - fVar7;
  fVar10 = pos[3].x - pos[1].x;
  fVar12 = pos[2].y - fVar8;
  fVar13 = pos[3].y - pos[1].y;
  fVar16 = fVar13 * fVar9 - fVar10 * fVar12;
  fVar11 = 0.0;
  if ((fVar16 != 0.0) || (NAN(fVar16))) {
    fVar17 = fVar8 - pos[1].y;
    fVar14 = fVar7 - pos[1].x;
    fVar15 = (1.0 / fVar16) * (fVar17 * fVar9 - fVar14 * fVar12);
    fVar13 = (1.0 / fVar16) * (fVar17 * fVar10 - fVar14 * fVar13);
    iVar6 = -(uint)(1.0 < fVar15);
    auVar2._4_4_ = iVar6;
    auVar2._0_4_ = iVar6;
    auVar2._8_4_ = -(uint)(1.0 < fVar13);
    auVar2._12_4_ = -(uint)(1.0 < fVar13);
    uVar5 = movmskpd(uVar5,auVar2);
    fVar10 = 0.0;
    if (((fVar15 < 0.0 | (byte)uVar5 | (byte)uVar5 >> 1 | fVar13 < 0.0) & 1) == 0) {
      fVar11 = fVar7 + fVar9 * fVar13;
      fVar10 = fVar8 + fVar12 * fVar13;
    }
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar7 = pos[lVar3].x - fVar11;
      fVar8 = pos[lVar3].y - fVar10;
      d[lVar3] = SQRT(fVar7 * fVar7 + fVar8 * fVar8);
    }
    for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
      fVar7 = d[uVar4];
      if ((fVar7 != 0.0) || (fVar8 = 1.0, NAN(fVar7))) {
        fVar8 = (fVar7 + d[uVar4 ^ 2]) / d[uVar4 ^ 2];
      }
      vVar1.y = fVar8 * pvStack_60[uVar4].y;
      vVar1.x = fVar8 * pvStack_60[uVar4].x;
      pvStack_60[uVar4] = vVar1;
      local_48[uVar4] = fVar8 * local_48[uVar4];
      fVar7 = pos[uVar4].x * (this->vInvScreenSize).x;
      fVar8 = pos[uVar4].y * (this->vInvScreenSize).y;
      ((pointer)(local_80._8_8_ + uVar4 * 8))->x = fVar7 + fVar7 + -1.0;
      ((pointer)(local_80._8_8_ + uVar4 * 8))->y = -(fVar8 + fVar8 + -1.0);
    }
    local_18._0_4_ = this->nDecalMode;
    std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
              (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
                _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
               (value_type *)local_80);
  }
  DecalInstance::~DecalInstance((DecalInstance *)local_80);
  return;
}

Assistant:

void PixelGameEngine::DrawWarpedDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::Pixel &tint)
	{
		// Thanks Nathan Reed, a brilliant article explaining whats going on here
		// http://www.reedbeta.com/blog/quadrilateral-interpolation-part-1/
		DecalInstance di;
		di.points = 4;
		di.decal = decal;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		olc::vf2d center;
		float rd = ((pos[2].x - pos[0].x) * (pos[3].y - pos[1].y) - (pos[3].x - pos[1].x) * (pos[2].y - pos[0].y));
		if (rd != 0)
		{
			rd = 1.0f / rd;
			float rn = ((pos[3].x - pos[1].x) * (pos[0].y - pos[1].y) - (pos[3].y - pos[1].y) * (pos[0].x - pos[1].x)) * rd;
			float sn = ((pos[2].x - pos[0].x) * (pos[0].y - pos[1].y) - (pos[2].y - pos[0].y) * (pos[0].x - pos[1].x)) * rd;
			if (!(rn < 0.f || rn > 1.f || sn < 0.f || sn > 1.f))
				center = pos[0] + rn * (pos[2] - pos[0]);
			float d[4];
			for (int i = 0; i < 4; i++)
				d[i] = (pos[i] - center).mag();
			for (int i = 0; i < 4; i++)
			{
				float q = d[i] == 0.0f ? 1.0f : (d[i] + d[(i + 2) & 3]) / d[(i + 2) & 3];
				di.uv[i] *= q;
				di.w[i] *= q;
				di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			}
			di.mode = nDecalMode;
			vLayers[nTargetLayer].vecDecalInstance.push_back(di);
		}
	}